

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode copy_noInit(void *src,void *dst,UA_DataType *type)

{
  UA_DataTypeMember *pUVar1;
  UA_StatusCode UVar2;
  ulong uVar3;
  UA_StatusCode UVar4;
  long lVar5;
  size_t size;
  UA_DataType *type_00;
  size_t *dst_size;
  size_t *psVar6;
  size_t *psVar7;
  UA_DataType *typelists [2];
  
  if (type->membersSize == 0) {
    UVar4 = 0;
  }
  else {
    lVar5 = 0;
    UVar4 = 0;
    typelists[1] = (UA_DataType *)((ulong)type->membersSize << 4);
    do {
      pUVar1 = type->members;
      typelists[0] = type + -(ulong)type->typeIndex;
      type_00 = (UA_DataType *)
                ((long)&typelists[(ulong)(~(uint)(byte)(&pUVar1->field_0xb)[lVar5] & 1) - 1]->
                        typeName +
                (ulong)((uint)*(ushort *)((long)&pUVar1->memberTypeIndex + lVar5) * 0x30));
      psVar7 = (size_t *)((long)src + (ulong)(&pUVar1->padding)[lVar5]);
      psVar6 = (size_t *)((long)dst + (ulong)(&pUVar1->padding)[lVar5]);
      if (((&pUVar1->field_0xb)[lVar5] & 2) == 0) {
        uVar3 = 0x19;
        if ((type_00->field_0x25 & 1) != 0) {
          uVar3 = (ulong)type_00->typeIndex;
        }
        UVar2 = (*copyJumpTable[uVar3])(psVar7,psVar6,type_00);
        UVar4 = UVar4 | UVar2;
        uVar3 = (ulong)type_00->memSize;
      }
      else {
        size = *psVar7;
        UVar2 = UA_Array_copy((void *)psVar7[1],size,(void **)(psVar6 + 1),type_00);
        UVar4 = UVar4 | UVar2;
        if (UVar4 != 0) {
          size = 0;
        }
        *psVar6 = size;
        uVar3 = 0x10;
      }
      src = (void *)((long)psVar7 + uVar3);
      dst = (void *)((long)psVar6 + uVar3);
      lVar5 = lVar5 + 0x10;
    } while (typelists[1] != (UA_DataType *)lVar5);
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
copy_noInit(const void *src, void *dst, const UA_DataType *type) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    uintptr_t ptrs = (uintptr_t)src;
    uintptr_t ptrd = (uintptr_t)dst;
    UA_Byte membersSize = type->membersSize;
    for(size_t i = 0; i < membersSize; ++i) {
        const UA_DataTypeMember *m= &type->members[i];
        const UA_DataType *typelists[2] = { UA_TYPES, &type[-type->typeIndex] };
        const UA_DataType *mt = &typelists[!m->namespaceZero][m->memberTypeIndex];
        if(!m->isArray) {
            ptrs += m->padding;
            ptrd += m->padding;
            size_t fi = mt->builtin ? mt->typeIndex : UA_BUILTIN_TYPES_COUNT;
            retval |= copyJumpTable[fi]((const void*)ptrs, (void*)ptrd, mt);
            ptrs += mt->memSize;
            ptrd += mt->memSize;
        } else {
            ptrs += m->padding;
            ptrd += m->padding;
            size_t *dst_size = (size_t*)ptrd;
            const size_t size = *((const size_t*)ptrs);
            ptrs += sizeof(size_t);
            ptrd += sizeof(size_t);
            retval |= UA_Array_copy(*(void* const*)ptrs, size, (void**)ptrd, mt);
            if(retval == UA_STATUSCODE_GOOD)
                *dst_size = size;
            else
                *dst_size = 0;
            ptrs += sizeof(void*);
            ptrd += sizeof(void*);
        }
    }
    return retval;
}